

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O2

void aes_sdctr_ni(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn encrypt)

{
  undefined4 in_register_00000014;
  __m128i *palVar1;
  ulong *puVar2;
  uint8_t *blk;
  ulong *puVar3;
  ulong extraout_XMM0_Qa;
  ssh_cipheralg *psVar4;
  ulong extraout_XMM0_Qb;
  __m128i alVar5;
  
  palVar1 = (__m128i *)CONCAT44(in_register_00000014,blklen);
  puVar2 = (ulong *)((long)blklen + (long)vblk);
  for (puVar3 = (ulong *)vblk; puVar3 < puVar2; puVar3 = puVar3 + 2) {
    pshufb(*(undefined1 (*) [16])(ciph + -3),_DAT_0013ce10);
    alVar5[1] = (longlong)vblk;
    alVar5[0] = (longlong)(ciph + -0x3f);
    alVar5 = (*encrypt)(alVar5,palVar1);
    palVar1 = alVar5[1];
    *puVar3 = *puVar3 ^ extraout_XMM0_Qa;
    puVar3[1] = puVar3[1] ^ extraout_XMM0_Qb;
    psVar4 = (ssh_cipheralg *)((long)&(ciph[-3].vt)->new + 1);
    ciph[-3].vt = psVar4;
    ciph[-2].vt = (ssh_cipheralg *)
                  ((long)ciph[-2].vt - ((long)-(ulong)(psVar4 == (ssh_cipheralg *)0x0) >> 0x3f));
  }
  return;
}

Assistant:

static inline void aes_sdctr_ni(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i counter = aes_ni_sdctr_reverse(ctx->iv);
        __m128i keystream = encrypt(counter, ctx->keysched_e);
        __m128i input = _mm_loadu_si128((const __m128i *)blk);
        __m128i output = _mm_xor_si128(input, keystream);
        _mm_storeu_si128((__m128i *)blk, output);
        ctx->iv = aes_ni_sdctr_increment(ctx->iv);
    }
}